

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::AddIncludeDirectory(cmGeneratorTarget *this,string *src,bool before)

{
  cmTarget *this_00;
  pointer ppTVar1;
  undefined1 auVar2 [8];
  const_iterator __position;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  auto_ptr<cmCompiledGeneratorExpression> local_78;
  undefined1 local_70 [8];
  cmListFileBacktrace lfbt;
  cmGeneratorExpression ge;
  
  this_00 = this->Target;
  cmMakefile::GetBacktrace(&lfbt,this->Makefile);
  cmTarget::InsertInclude(this_00,src,&lfbt,before);
  cmListFileBacktrace::~cmListFileBacktrace(&lfbt);
  cmMakefile::GetBacktrace(&lfbt,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression(&ge,&lfbt);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,(string *)&ge);
  auVar2 = local_70;
  local_70 = (undefined1  [8])0x0;
  cge.x_ = (cmCompiledGeneratorExpression *)auVar2;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  *(bool *)((long)auVar2 + 0x178) = true;
  ppTVar1 = (this->IncludeDirectoriesEntries).
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->IncludeDirectoriesEntries).
       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = (undefined1  [8])operator_new(0x10);
  if (before) {
    __position._M_current = ppTVar1;
  }
  cge.x_ = (cmCompiledGeneratorExpression *)0x0;
  local_78.x_ = (cmCompiledGeneratorExpression *)0x0;
  *(undefined1 (*) [8])&(((cmState *)local_70)->PropertyDefinitions)._M_t._M_impl = auVar2;
  *(cmLinkImplItem **)
   &(((cmState *)local_70)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header =
       &TargetPropertyEntry::NoLinkImplItem;
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::_M_insert_rval(&this->IncludeDirectoriesEntries,__position,(value_type *)local_70);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_78);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  cmListFileBacktrace::~cmListFileBacktrace(&lfbt);
  return;
}

Assistant:

void cmGeneratorTarget::AddIncludeDirectory(const std::string& src,
                                            bool before)
{
  this->Target->InsertInclude(src, this->Makefile->GetBacktrace(), before);
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  // Insert before begin/end
  std::vector<TargetPropertyEntry*>::iterator pos = before
    ? this->IncludeDirectoriesEntries.begin()
    : this->IncludeDirectoriesEntries.end();
  this->IncludeDirectoriesEntries.insert(pos, new TargetPropertyEntry(cge));
}